

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::anon_unknown_0::HasRequiredFields
               (Descriptor *type,
               hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
               *already_seen)

{
  int *piVar1;
  Descriptor **ppDVar2;
  bool bVar3;
  long lVar4;
  _Node *p_Var5;
  bool bVar6;
  long lVar7;
  long lVar8;
  Descriptor *local_48;
  undefined1 local_40 [24];
  
  p_Var5 = (already_seen->
           super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ).
           super___unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>,_false>
           .
           super__Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
           ._M_buckets
           [(ulong)type %
            (already_seen->
            super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ).
            super___unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>,_false>
            .
            super__Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
            ._M_bucket_count];
  if (p_Var5 != (_Node *)0x0) {
    lVar4 = 0;
    do {
      ppDVar2 = &p_Var5->_M_v;
      p_Var5 = p_Var5->_M_next;
      lVar4 = lVar4 + (ulong)(*ppDVar2 == type);
    } while (p_Var5 != (_Hash_node<const_google::protobuf::Descriptor_*,_false> *)0x0);
    if (lVar4 != 0) {
      return false;
    }
  }
  local_48 = type;
  std::tr1::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
  ::_M_insert(local_40,(_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                        *)already_seen,&local_48);
  bVar6 = true;
  if (((*(int *)(local_48 + 0x58) < 1) &&
      (bVar6 = 0 < *(int *)(local_48 + 0x2c), 0 < *(int *)(local_48 + 0x2c))) &&
     (lVar4 = *(long *)(local_48 + 0x30), *(int *)(lVar4 + 0x30) != 2)) {
    lVar8 = 0xa8;
    lVar7 = 0;
    do {
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar4 + 0x2c) * 4) == 10)
         && (bVar3 = HasRequiredFields(*(Descriptor **)(lVar4 + 0x48),already_seen), bVar3)) {
        return bVar6;
      }
      lVar7 = lVar7 + 1;
      bVar6 = lVar7 < *(int *)(local_48 + 0x2c);
      if (*(int *)(local_48 + 0x2c) <= lVar7) {
        return bVar6;
      }
      lVar4 = lVar7 * 0x78 + *(long *)(local_48 + 0x30);
      piVar1 = (int *)(*(long *)(local_48 + 0x30) + lVar8);
      lVar8 = lVar8 + 0x78;
    } while (*piVar1 != 2);
  }
  return bVar6;
}

Assistant:

static bool HasRequiredFields(
    const Descriptor* type,
    hash_set<const Descriptor*>* already_seen) {
  if (already_seen->count(type) > 0) {
    // Since the first occurrence of a required field causes the whole
    // function to return true, we can assume that if the type is already
    // in the cache it didn't have any required fields.
    return false;
  }
  already_seen->insert(type);

  // If the type has extensions, an extension with message type could contain
  // required fields, so we have to be conservative and assume such an
  // extension exists.
  if (type->extension_range_count() > 0) return true;

  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);
    if (field->is_required()) {
      return true;
    }
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field)) {
      if (HasRequiredFields(field->message_type(), already_seen)) {
        return true;
      }
    }
  }

  return false;
}